

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_wraith.cpp
# Opt level: O2

int AF_A_WraithFX3(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  double dVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  AActor *pAVar7;
  AActor *this_00;
  ulong uVar8;
  char *__assertion;
  FName local_4c;
  DVector3 local_48;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0054536d;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this_00 = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this_00 == (AActor *)0x0) {
LAB_005451ec:
        this_00 = (AActor *)0x0;
      }
      else {
        bVar3 = DObject::IsKindOf((DObject *)this_00,AActor::RegistrationInfo.MyClass);
        if (!bVar3) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0054536d;
        }
      }
      if (numparam == 1) goto LAB_0054526c;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_0054535d;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar3 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar3) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0054536d;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_0054535d;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0054526c:
        iVar4 = FRandom::operator()(&pr_wraithfx3);
        for (uVar8 = (long)iVar4 % 0xf & 0xffffffff; 0 < (int)uVar8; uVar8 = (ulong)((int)uVar8 - 1)
            ) {
          iVar4 = FRandom::operator()(&pr_wraithfx3);
          iVar5 = FRandom::operator()(&pr_wraithfx3);
          iVar6 = FRandom::operator()(&pr_wraithfx3);
          FName::FName(&local_4c,"WraithFX3");
          AActor::Vec3Offset(&local_48,this_00,(double)(iVar4 + -0x80) * 0.03125,
                             (double)(iVar5 + -0x80) * 0.03125,(double)iVar6 * 0.015625,false);
          pAVar7 = Spawn(&local_4c,&local_48,ALLOW_REPLACE);
          if (pAVar7 != (AActor *)0x0) {
            dVar2 = this_00->ceilingz;
            pAVar7->floorz = this_00->floorz;
            pAVar7->ceilingz = dVar2;
            (pAVar7->target).field_0.p = this_00;
          }
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0054536d;
    }
    if (this_00 == (AActor *)0x0) goto LAB_005451ec;
  }
LAB_0054535d:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0054536d:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_wraith.cpp"
                ,0x96,"int AF_A_WraithFX3(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_WraithFX3)
{
	PARAM_ACTION_PROLOGUE;

	AActor *mo;
	int numdropped = pr_wraithfx3() % 15;

	while (numdropped-- > 0)
	{
		double xo = (pr_wraithfx3() - 128) / 32.;
		double yo = (pr_wraithfx3() - 128) / 32.;
		double zo = pr_wraithfx3() / 64.;

		mo = Spawn("WraithFX3", self->Vec3Offset(xo, yo, zo), ALLOW_REPLACE);
		if (mo)
		{
			mo->floorz = self->floorz;
			mo->ceilingz = self->ceilingz;
			mo->target = self;
		}
	}
	return 0;
}